

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

void __thiscall
AlignmentRecord::mergeAlignmentRecordsSingle(AlignmentRecord *this,AlignmentRecord *ar,int i,int j)

{
  pointer *ppcVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pCVar4;
  iterator iVar5;
  uint *puVar6;
  long lVar7;
  _Alloc_hider _Var8;
  int iVar9;
  int iVar10;
  uint uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__tmp;
  size_t sVar12;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  long lVar13;
  size_type sVar14;
  int iVar15;
  int iVar16;
  uint *puVar17;
  AlignmentRecord *this_00;
  char *__end;
  int *piVar18;
  int ref_s_pos2;
  AlignmentRecord *local_178;
  int local_16c;
  int ref_s_pos1;
  int ref_rel_pos1;
  undefined8 local_160;
  int q_pos2;
  undefined8 local_150;
  int local_148;
  int c_pos2;
  int c_pos1;
  int q_pos1;
  vector<char,_std::allocator<char>_> cigar;
  element_type *local_120;
  shared_count local_118;
  element_type *local_110;
  shared_count local_108;
  element_type *local_100;
  shared_count local_f8;
  string qualities;
  shared_count asStack_c0 [2];
  string nucigar;
  string ref;
  string algn;
  string dna;
  
  local_150 = CONCAT44(in_register_00000014,i);
  local_160 = CONCAT44(in_register_0000000c,j);
  dna._M_dataplus._M_p = (pointer)&dna.field_2;
  local_178 = ar;
  std::__cxx11::string::_M_construct<char_const*>((string *)&dna,"","");
  ref._M_dataplus._M_p = (pointer)&ref.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ref,"","");
  algn._M_dataplus._M_p = (pointer)&algn.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&algn,"");
  qualities._M_dataplus._M_p = (pointer)&qualities.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&qualities,"");
  nucigar._M_dataplus._M_p = (pointer)&nucigar.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&nucigar,"");
  if ((int)local_150 == 1) {
    pcVar2 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar2 == pcVar3) {
      iVar15 = 0;
    }
    else {
      iVar15 = (int)pcVar3 - (int)pcVar2;
      lVar13 = 0;
      do {
        if ((pcVar2[lVar13] != 'S') && (pcVar2[lVar13] != 'H')) {
          iVar15 = (int)lVar13;
          break;
        }
        lVar7 = lVar13 + 1;
        lVar13 = lVar13 + 1;
      } while (pcVar2 + lVar7 != pcVar3);
    }
    iVar9 = computeRevOffset(&this->cigar1_unrolled);
    iVar9 = iVar9 + this->end1;
    iVar15 = this->start1 - iVar15;
    ref_s_pos1 = iVar15;
    if ((int)local_160 == 1) {
      std::vector<char,_std::allocator<char>_>::vector(&cigar,&local_178->cigar1_unrolled);
      if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        iVar16 = 0;
      }
      else {
        iVar16 = (int)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                 (int)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        lVar13 = 0;
        do {
          if ((cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar13] != 'S') &&
             (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar13] != 'H')) {
            iVar16 = (int)lVar13;
            break;
          }
          lVar7 = lVar13 + 1;
          lVar13 = lVar13 + 1;
        } while (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar7 !=
                 cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      iVar10 = computeRevOffset(&cigar);
      ref_s_pos2 = local_178->start1 - iVar16;
      iVar10 = iVar10 + local_178->end1;
    }
    else {
      std::vector<char,_std::allocator<char>_>::vector(&cigar,&local_178->cigar2_unrolled);
      if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        iVar16 = 0;
      }
      else {
        iVar16 = (int)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                 (int)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        lVar13 = 0;
        do {
          if ((cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar13] != 'S') &&
             (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar13] != 'H')) {
            iVar16 = (int)lVar13;
            break;
          }
          lVar7 = lVar13 + 1;
          lVar13 = lVar13 + 1;
        } while (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar7 !=
                 cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      iVar10 = computeRevOffset(&cigar);
      ref_s_pos2 = local_178->start2 - iVar16;
      iVar10 = iVar10 + local_178->end2;
    }
  }
  else {
    pcVar2 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar2 == pcVar3) {
      iVar15 = 0;
    }
    else {
      iVar15 = (int)pcVar3 - (int)pcVar2;
      lVar13 = 0;
      do {
        if ((pcVar2[lVar13] != 'S') && (pcVar2[lVar13] != 'H')) {
          iVar15 = (int)lVar13;
          break;
        }
        lVar7 = lVar13 + 1;
        lVar13 = lVar13 + 1;
      } while (pcVar2 + lVar7 != pcVar3);
    }
    iVar9 = computeRevOffset(&this->cigar2_unrolled);
    iVar15 = this->start2 - iVar15;
    iVar9 = iVar9 + this->end2;
    ref_s_pos1 = iVar15;
    if ((int)local_160 == 1) {
      std::vector<char,_std::allocator<char>_>::vector(&cigar,&local_178->cigar1_unrolled);
      if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        iVar16 = 0;
      }
      else {
        iVar16 = (int)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                 (int)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        lVar13 = 0;
        do {
          if ((cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar13] != 'S') &&
             (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar13] != 'H')) {
            iVar16 = (int)lVar13;
            break;
          }
          lVar7 = lVar13 + 1;
          lVar13 = lVar13 + 1;
        } while (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar7 !=
                 cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      iVar10 = computeRevOffset(&cigar);
      ref_s_pos2 = local_178->start1 - iVar16;
      iVar10 = iVar10 + local_178->end1;
    }
    else {
      std::vector<char,_std::allocator<char>_>::vector(&cigar,&local_178->cigar2_unrolled);
      if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        iVar16 = 0;
      }
      else {
        iVar16 = (int)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                 (int)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        lVar13 = 0;
        do {
          if ((cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar13] != 'S') &&
             (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar13] != 'H')) {
            iVar16 = (int)lVar13;
            break;
          }
          lVar7 = lVar13 + 1;
          lVar13 = lVar13 + 1;
        } while (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar7 !=
                 cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      iVar10 = computeRevOffset(&cigar);
      ref_s_pos2 = local_178->start2 - iVar16;
      iVar10 = iVar10 + local_178->end2;
    }
  }
  local_16c = ref_s_pos2;
  if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  q_pos1 = 0;
  q_pos2 = 0;
  c_pos1 = 0;
  c_pos2 = 0;
  ref_rel_pos1 = 0;
  local_148 = 0;
  if ((local_16c < iVar15) || (iVar10 < iVar9)) {
    if ((local_16c < iVar15) || (iVar9 < iVar10)) {
      if ((local_16c <= iVar15) && (iVar9 <= iVar10)) {
        while (ref_s_pos2 < iVar15) {
          noOverlapMerge(local_178,&algn,&ref,&dna,&qualities,&nucigar,&c_pos2,&q_pos2,&ref_s_pos2,
                         &local_148,(int)local_160);
        }
        while (ref_s_pos2 <= iVar9) {
          overlapMerge(this,&algn,&ref,local_178,&dna,&qualities,&nucigar,&c_pos1,&c_pos2,&q_pos1,
                       &q_pos2,&ref_s_pos2,&ref_rel_pos1,(int)local_150,(int)local_160);
        }
        local_148 = ref_rel_pos1 + local_148 + -1;
        while (ref_s_pos2 <= iVar10) {
          noOverlapMerge(local_178,&algn,&ref,&dna,&qualities,&nucigar,&c_pos2,&q_pos2,&ref_s_pos2,
                         &local_148,(int)local_160);
        }
        goto LAB_00167981;
      }
      while (ref_s_pos2 < iVar15) {
        noOverlapMerge(local_178,&algn,&ref,&dna,&qualities,&nucigar,&c_pos2,&q_pos2,&ref_s_pos2,
                       &local_148,(int)local_160);
      }
      while (ref_s_pos2 <= iVar10) {
        overlapMerge(this,&algn,&ref,local_178,&dna,&qualities,&nucigar,&c_pos1,&c_pos2,&q_pos1,
                     &q_pos2,&ref_s_pos2,&ref_rel_pos1,(int)local_150,(int)local_160);
      }
      while (ref_s_pos2 <= iVar9) {
        noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos2,
                       &ref_rel_pos1,(int)local_150);
      }
    }
    else {
      while (ref_s_pos1 < local_16c) {
        noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                       &ref_rel_pos1,(int)local_150);
      }
      while (ref_s_pos1 <= iVar10) {
        overlapMerge(this,&algn,&ref,local_178,&dna,&qualities,&nucigar,&c_pos1,&c_pos2,&q_pos1,
                     &q_pos2,&ref_s_pos1,&ref_rel_pos1,(int)local_150,(int)local_160);
      }
      while (ref_s_pos1 <= iVar9) {
        noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                       &ref_rel_pos1,(int)local_150);
      }
    }
    piVar18 = &ref_rel_pos1;
    iVar15 = (int)local_150;
    this_00 = this;
  }
  else {
    while (ref_s_pos1 < local_16c) {
      noOverlapMerge(this,&algn,&ref,&dna,&qualities,&nucigar,&c_pos1,&q_pos1,&ref_s_pos1,
                     &ref_rel_pos1,(int)local_150);
    }
    local_16c = ref_rel_pos1;
    while (ref_s_pos1 <= iVar9) {
      overlapMerge(this,&algn,&ref,local_178,&dna,&qualities,&nucigar,&c_pos1,&c_pos2,&q_pos1,
                   &q_pos2,&ref_s_pos1,&ref_rel_pos1,(int)local_150,(int)local_160);
    }
    local_148 = ref_rel_pos1 - local_16c;
    while (ref_s_pos1 <= iVar10) {
      noOverlapMerge(local_178,&algn,&ref,&dna,&qualities,&nucigar,&c_pos2,&q_pos2,&ref_s_pos1,
                     &local_148,(int)local_160);
    }
LAB_00167981:
    piVar18 = &local_148;
    iVar15 = (int)local_160;
    this_00 = local_178;
  }
  updateReference(this_00,&ref,iVar15,*piVar18);
  if ((int)local_150 == 1) {
    uVar11 = this->start1;
    if ((int)local_160 == 1) {
      if (local_178->start1 < uVar11) {
        uVar11 = local_178->start1;
      }
      this->start1 = uVar11;
      uVar11 = this->end1;
      if (this->end1 < local_178->end1) {
        uVar11 = local_178->end1;
      }
      this->end1 = uVar11;
      this->single_end = true;
      createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar,&nucigar);
      pCVar4 = (this->cigar1).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if ((pCVar4 != (pointer)0x0) &&
         (operator_delete(pCVar4),
         cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start != (pointer)0x0)) {
        operator_delete(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&cigar,&dna,&qualities);
      if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        LOCK();
        *(int *)(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 8) =
             *(int *)(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 8) + 1;
        UNLOCK();
      }
      asStack_c0[0].pi_ = (this->sequence1).forward.pn.pi_;
      (this->sequence1).forward.px =
           (element_type *)
           cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      (this->sequence1).forward.pn.pi_ =
           (sp_counted_base *)
           cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      boost::detail::shared_count::~shared_count(asStack_c0);
      if (local_118.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_118.pi_)->use_count_ = (local_118.pi_)->use_count_ + 1;
        UNLOCK();
      }
      asStack_c0[0].pi_ = (this->sequence1).forward_qualities.pn.pi_;
      (this->sequence1).forward_qualities.px = local_120;
      (this->sequence1).forward_qualities.pn.pi_ = local_118.pi_;
      boost::detail::shared_count::~shared_count(asStack_c0);
      if (local_108.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_108.pi_)->use_count_ = (local_108.pi_)->use_count_ + 1;
        UNLOCK();
      }
      asStack_c0[0].pi_ = (this->sequence1).backward.pn.pi_;
      (this->sequence1).backward.px = local_110;
      (this->sequence1).backward.pn.pi_ = local_108.pi_;
      boost::detail::shared_count::~shared_count(asStack_c0);
      if (local_f8.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_f8.pi_)->use_count_ = (local_f8.pi_)->use_count_ + 1;
        UNLOCK();
      }
      asStack_c0[0].pi_ = (this->sequence1).backward_qualities.pn.pi_;
      (this->sequence1).backward_qualities.px = local_100;
      (this->sequence1).backward_qualities.pn.pi_ = local_f8.pi_;
      boost::detail::shared_count::~shared_count(asStack_c0);
      ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&cigar);
      if (qualities._M_string_length == 0) {
        iVar15 = 0;
      }
      else {
        sVar14 = 0;
        iVar15 = 0;
        do {
          iVar15 = iVar15 + qualities._M_dataplus._M_p[sVar14] + -0x21;
          sVar14 = sVar14 + 1;
        } while (qualities._M_string_length != sVar14);
      }
      this->phred_sum1 = iVar15;
      sVar12 = ShortDnaSequence::size(&this->sequence1);
      this->length_incl_deletions1 = (int)sVar12;
      sVar12 = ShortDnaSequence::size(&this->sequence1);
      _Var8 = nucigar._M_dataplus;
      this->length_incl_longdeletions1 = (int)sVar12;
      pcVar2 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar2) {
        (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar2;
      }
      if (nucigar._M_string_length != 0) {
        sVar14 = 0;
        do {
          cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT71(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                       .super__Vector_impl_data._M_start._1_7_,_Var8._M_p[sVar14]);
          iVar5._M_current =
               (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&this->cigar1_unrolled,iVar5,
                       (char *)&cigar);
          }
          else {
            *iVar5._M_current = _Var8._M_p[sVar14];
            ppcVar1 = &(this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          sVar14 = sVar14 + 1;
        } while (nucigar._M_string_length != sVar14);
      }
      std::__cxx11::string::_M_assign((string *)&this->reference_seq1);
      lVar13 = 0x2e0;
      std::__cxx11::string::_M_assign((string *)&this->alignSequence1);
    }
    else {
      if (local_178->start2 < uVar11) {
        uVar11 = local_178->start2;
      }
      this->start2 = uVar11;
      uVar11 = local_178->end2;
      if (local_178->end2 < this->end1) {
        uVar11 = this->end1;
      }
      this->end2 = uVar11;
      createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar,&nucigar);
      pCVar4 = (this->cigar2).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if ((pCVar4 != (pointer)0x0) &&
         (operator_delete(pCVar4),
         cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start != (pointer)0x0)) {
        operator_delete(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&cigar,&dna,&qualities);
      if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        LOCK();
        *(int *)(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 8) =
             *(int *)(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 8) + 1;
        UNLOCK();
      }
      asStack_c0[0].pi_ = (this->sequence2).forward.pn.pi_;
      (this->sequence2).forward.px =
           (element_type *)
           cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      (this->sequence2).forward.pn.pi_ =
           (sp_counted_base *)
           cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      boost::detail::shared_count::~shared_count(asStack_c0);
      if (local_118.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_118.pi_)->use_count_ = (local_118.pi_)->use_count_ + 1;
        UNLOCK();
      }
      asStack_c0[0].pi_ = (this->sequence2).forward_qualities.pn.pi_;
      (this->sequence2).forward_qualities.px = local_120;
      (this->sequence2).forward_qualities.pn.pi_ = local_118.pi_;
      boost::detail::shared_count::~shared_count(asStack_c0);
      if (local_108.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_108.pi_)->use_count_ = (local_108.pi_)->use_count_ + 1;
        UNLOCK();
      }
      asStack_c0[0].pi_ = (this->sequence2).backward.pn.pi_;
      (this->sequence2).backward.px = local_110;
      (this->sequence2).backward.pn.pi_ = local_108.pi_;
      boost::detail::shared_count::~shared_count(asStack_c0);
      if (local_f8.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_f8.pi_)->use_count_ = (local_f8.pi_)->use_count_ + 1;
        UNLOCK();
      }
      asStack_c0[0].pi_ = (this->sequence2).backward_qualities.pn.pi_;
      (this->sequence2).backward_qualities.px = local_100;
      (this->sequence2).backward_qualities.pn.pi_ = local_f8.pi_;
      boost::detail::shared_count::~shared_count(asStack_c0);
      ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&cigar);
      if (qualities._M_string_length == 0) {
        iVar15 = 0;
      }
      else {
        sVar14 = 0;
        iVar15 = 0;
        do {
          iVar15 = iVar15 + qualities._M_dataplus._M_p[sVar14] + -0x21;
          sVar14 = sVar14 + 1;
        } while (qualities._M_string_length != sVar14);
      }
      this->phred_sum2 = iVar15;
      sVar12 = ShortDnaSequence::size(&this->sequence2);
      this->length_incl_deletions2 = (int)sVar12;
      sVar12 = ShortDnaSequence::size(&this->sequence2);
      _Var8 = nucigar._M_dataplus;
      this->length_incl_longdeletions2 = (int)sVar12;
      pcVar2 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar2) {
        (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar2;
      }
      if (nucigar._M_string_length != 0) {
        sVar14 = 0;
        do {
          cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT71(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                       .super__Vector_impl_data._M_start._1_7_,_Var8._M_p[sVar14]);
          iVar5._M_current =
               (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&this->cigar2_unrolled,iVar5,
                       (char *)&cigar);
          }
          else {
            *iVar5._M_current = _Var8._M_p[sVar14];
            ppcVar1 = &(this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          sVar14 = sVar14 + 1;
        } while (nucigar._M_string_length != sVar14);
      }
      std::__cxx11::string::_M_assign((string *)&this->reference_seq2);
      lVar13 = 0x2f8;
      std::__cxx11::string::_M_assign((string *)&this->alignSequence2);
    }
  }
  else {
    this->single_end = false;
    createCigar((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)&cigar,&nucigar);
    pCVar4 = (this->cigar2).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (pointer)cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((pCVar4 != (pointer)0x0) &&
       (operator_delete(pCVar4),
       cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start != (pointer)0x0)) {
      operator_delete(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&cigar,&dna,&qualities);
    if (cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      LOCK();
      *(int *)(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage + 8) =
           *(int *)(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 8) + 1;
      UNLOCK();
    }
    asStack_c0[0].pi_ = (this->sequence2).forward.pn.pi_;
    (this->sequence2).forward.px =
         (element_type *)
         cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    (this->sequence2).forward.pn.pi_ =
         (sp_counted_base *)
         cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    boost::detail::shared_count::~shared_count(asStack_c0);
    if (local_118.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_118.pi_)->use_count_ = (local_118.pi_)->use_count_ + 1;
      UNLOCK();
    }
    asStack_c0[0].pi_ = (this->sequence2).forward_qualities.pn.pi_;
    (this->sequence2).forward_qualities.px = local_120;
    (this->sequence2).forward_qualities.pn.pi_ = local_118.pi_;
    boost::detail::shared_count::~shared_count(asStack_c0);
    if (local_108.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_108.pi_)->use_count_ = (local_108.pi_)->use_count_ + 1;
      UNLOCK();
    }
    asStack_c0[0].pi_ = (this->sequence2).backward.pn.pi_;
    (this->sequence2).backward.px = local_110;
    (this->sequence2).backward.pn.pi_ = local_108.pi_;
    boost::detail::shared_count::~shared_count(asStack_c0);
    if (local_f8.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_f8.pi_)->use_count_ = (local_f8.pi_)->use_count_ + 1;
      UNLOCK();
    }
    asStack_c0[0].pi_ = (this->sequence2).backward_qualities.pn.pi_;
    (this->sequence2).backward_qualities.px = local_100;
    (this->sequence2).backward_qualities.pn.pi_ = local_f8.pi_;
    boost::detail::shared_count::~shared_count(asStack_c0);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&cigar);
    if (qualities._M_string_length == 0) {
      iVar15 = 0;
    }
    else {
      sVar14 = 0;
      iVar15 = 0;
      do {
        iVar15 = iVar15 + qualities._M_dataplus._M_p[sVar14] + -0x21;
        sVar14 = sVar14 + 1;
      } while (qualities._M_string_length != sVar14);
    }
    this->phred_sum2 = iVar15;
    sVar12 = ShortDnaSequence::size(&this->sequence2);
    this->length_incl_deletions2 = (int)sVar12;
    sVar12 = ShortDnaSequence::size(&this->sequence2);
    _Var8 = nucigar._M_dataplus;
    this->length_incl_longdeletions2 = (int)sVar12;
    pcVar2 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar2) {
      (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar2;
    }
    if (nucigar._M_string_length != 0) {
      sVar14 = 0;
      do {
        cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT71(cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_start._1_7_,_Var8._M_p[sVar14]);
        iVar5._M_current =
             (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&this->cigar2_unrolled,iVar5,
                     (char *)&cigar);
        }
        else {
          *iVar5._M_current = _Var8._M_p[sVar14];
          ppcVar1 = &(this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        sVar14 = sVar14 + 1;
      } while (nucigar._M_string_length != sVar14);
    }
    puVar6 = &local_178->start1;
    puVar17 = &local_178->end1;
    if ((int)local_160 != 1) {
      puVar17 = &local_178->end2;
      puVar6 = &local_178->start2;
    }
    uVar11 = this->start2;
    if (*puVar6 < this->start2) {
      uVar11 = *puVar6;
    }
    this->start2 = uVar11;
    uVar11 = this->end2;
    if (this->end2 < *puVar17) {
      uVar11 = *puVar17;
    }
    this->end2 = uVar11;
    std::__cxx11::string::_M_assign((string *)&this->reference_seq2);
    lVar13 = 0x2f8;
    std::__cxx11::string::_M_assign((string *)&this->alignSequence2);
  }
  std::vector<int,std::allocator<int>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<int,std::allocator<int>> *)((long)&(this->name)._M_dataplus._M_p + lVar13),
             qualities._M_dataplus._M_p,qualities._M_dataplus._M_p + qualities._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nucigar._M_dataplus._M_p != &nucigar.field_2) {
    operator_delete(nucigar._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)qualities._M_dataplus._M_p != &qualities.field_2) {
    operator_delete(qualities._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)algn._M_dataplus._M_p != &algn.field_2) {
    operator_delete(algn._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ref._M_dataplus._M_p != &ref.field_2) {
    operator_delete(ref._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dna._M_dataplus._M_p != &dna.field_2) {
    operator_delete(dna._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AlignmentRecord::mergeAlignmentRecordsSingle(const AlignmentRecord& ar, int i, int j){
    std::string dna = "";
    std::string ref = "";
    std::string algn = "";
    std::string qualities = "";
    std::string nucigar = "";
    int offset_f1, offset_f2, offset_b1, offset_b2, ref_s_pos1, ref_e_pos1, ref_s_pos2,ref_e_pos2 = 0;
    //i and j determine which cigar strings / sequences are considered

    if (i == 1){
         //get starting position and ending position according to ref position, paying attention to clipped bases
         //updated ref position including clips
         offset_f1 = computeOffset(this->cigar1_unrolled);
         offset_b1 = computeRevOffset(this->cigar1_unrolled);
         ref_e_pos1 = this->end1+offset_b1;
         ref_s_pos1 = this->start1-offset_f1;
         if(j == 1){
             std::vector<char> cigar = ar.getCigar1Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart1()-offset_f2;
             ref_e_pos2 = ar.getEnd1()+offset_b2;
         } else {
             std::vector<char> cigar = ar.getCigar2Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart2()-offset_f2;
             ref_e_pos2 = ar.getEnd2()+offset_b2;
         }
    } else {
         //get starting position and ending position according to ref position, paying attention to clipped bases
         //updated ref position including clips
         offset_f1 = computeOffset(this->cigar2_unrolled);
         offset_b1 = computeRevOffset(this->cigar2_unrolled);
         ref_s_pos1 = this->start2-offset_f1;
         ref_e_pos1 = this->end2+offset_b1;
         if(j == 1){
             std::vector<char> cigar = ar.getCigar1Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart1()-offset_f2;
             ref_e_pos2 = ar.getEnd1()+offset_b2;
         } else {
             std::vector<char> cigar = ar.getCigar2Unrolled();
             offset_f2 = computeOffset(cigar);
             offset_b2 = computeRevOffset(cigar);
             ref_s_pos2 = ar.getStart2()-offset_f2;
             ref_e_pos2 = ar.getEnd2()+offset_b2;
         }
    }

    //position in query sequences // phred scores
    int q_pos1 = 0;
    int q_pos2 = 0;
    //position in unrolled cigar vectors
    int c_pos1 = 0;
    int c_pos2 = 0;
    //Position in the reference strings
    int ref_rel_pos1 =0;
    int ref_rel_pos2 =0;
    //4 cases of different overlaps
    //------------
    //     ------------
    if(ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
        while(ref_s_pos1<ref_s_pos2){
            noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,i);
        }
        ref_rel_pos2 = ref_rel_pos1;
        while(ref_s_pos1<=ref_e_pos1){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1,ref_rel_pos1,i,j);
        }
        ref_rel_pos2 = ref_rel_pos1-ref_rel_pos2;
        while(ref_s_pos1<=ref_e_pos2){
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos1,ref_rel_pos2,j);
        }
        ar.updateReference(ref,j,ref_rel_pos2);

    }//------------------------------
        //           ----------
     else if (ref_s_pos1 <= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2){
        while(ref_s_pos1<ref_s_pos2){
            noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,i);
        }
        while(ref_s_pos1<=ref_e_pos2){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos1,ref_rel_pos1,i,j);
        }
        while(ref_s_pos1<=ref_e_pos1){
            noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,i);
        }
        updateReference(ref,i,ref_rel_pos1);
        //           ----------
        //--------------------------
    } else if (ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 <= ref_e_pos2){
        while(ref_s_pos2<ref_s_pos1){
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos2,ref_rel_pos2,j);
        }
        while(ref_s_pos2<=ref_e_pos1){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2,ref_rel_pos1,i,j);
        }
        ref_rel_pos2 += ref_rel_pos1-1;
        while(ref_s_pos2<=ref_e_pos2){//Why is it less that equals here?Check with paper
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos2,ref_rel_pos2,j);
        }
        ar.updateReference(ref,j,ref_rel_pos2);
        //           --------------------
        //---------------------
    } else {
        assert(ref_s_pos1 >= ref_s_pos2 && ref_e_pos1 >= ref_e_pos2);
        while(ref_s_pos2<ref_s_pos1){
            ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos2, q_pos2, ref_s_pos2,ref_rel_pos2,j);
        }
        while(ref_s_pos2<=ref_e_pos2){
            overlapMerge(algn,ref,ar,dna,qualities,nucigar, c_pos1,c_pos2,q_pos1,q_pos2,ref_s_pos2,ref_rel_pos1,i,j);
        }
        while(ref_s_pos2<=ref_e_pos1){
            noOverlapMerge(algn,ref,dna,qualities,nucigar, c_pos1,q_pos1,ref_s_pos2,ref_rel_pos1,i);
        }
        updateReference(ref,i,ref_rel_pos1);

    }
    if (i == 1){
        if(j == 1){
            this->start1 = std::min(this->start1,ar.getStart1());
            this->end1=std::max(ar.getEnd1(),this->end1);
            this->single_end= true;
            this->cigar1 = createCigar(nucigar);
            this->sequence1=ShortDnaSequence(dna,qualities);
            this->phred_sum1=phred_sum(qualities);
            this->length_incl_deletions1 = this->sequence1.size();
            this->length_incl_longdeletions1 = this->sequence1.size();
            this->cigar1_unrolled.clear();
            for (char i : nucigar){
                this->cigar1_unrolled.push_back(i);
            }
            this->reference_seq1 = ref;
            this->alignSequence1 = algn;
            this->qualityList1.assign(qualities.begin(),qualities.end());

        } else {
            this->start2 = std::min(this->start1,ar.getStart2());
            this->end2 = std::max(this->end1,ar.getEnd2());
            this->cigar2 = createCigar(nucigar);
            this->sequence2=ShortDnaSequence(dna,qualities);
            this->phred_sum2=phred_sum(qualities);
            this->length_incl_deletions2 = this->sequence2.size();
            this->length_incl_longdeletions2 = this->sequence2.size();
            this->cigar2_unrolled.clear();
            for (char i : nucigar){
                this->cigar2_unrolled.push_back(i);
            }
            this->reference_seq2 = ref;
            this->alignSequence2 = algn;
            this->qualityList2.assign(qualities.begin(),qualities.end());
        }
    } else {
        this->single_end= false;
        this->cigar2 = createCigar(nucigar);
        this->sequence2=ShortDnaSequence(dna,qualities);
        this->phred_sum2=phred_sum(qualities);
        this->length_incl_deletions2 = this->sequence2.size();
        this->length_incl_longdeletions2 = this->sequence2.size();
        this->cigar2_unrolled.clear();
        for (char i : nucigar){
            this->cigar2_unrolled.push_back(i);
        }
        if(j == 1){
            this->start2 = std::min(this->start2,ar.getStart1());
            this->end2=std::max(ar.getEnd1(),this->end2);

        }else {
            this->start2 = std::min(this->start2,ar.getStart2());
            this->end2=std::max(ar.getEnd2(),this->end2);
        }
        this->reference_seq2 = ref;
        this->alignSequence2 = algn;
        this->qualityList2.assign(qualities.begin(),qualities.end());
    }
}